

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  LRUHandle *pLVar1;
  int s;
  long lVar2;
  Mutex *__mutex;
  Slice local_40;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    __mutex = &this->shard_[lVar2].mutex_;
    std::mutex::lock(&__mutex->mu_);
    while (pLVar1 = this->shard_[lVar2].lru_.next, pLVar1 != &this->shard_[lVar2].lru_) {
      local_40.data_ = pLVar1->key_data;
      local_40.size_ = pLVar1->key_length;
      pLVar1 = HandleTable::Remove(&this->shard_[lVar2].table_,&local_40,pLVar1->hash);
      LRUCache::FinishErase(this->shard_ + lVar2,pLVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }